

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O1

bool dxil_spv::emit_wave_multi_prefix_op_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Id IVar3;
  Id IVar4;
  Id IVar5;
  Builder *pBVar6;
  Value *pVVar7;
  Type *pTVar8;
  Operation *this;
  Operation *pOVar9;
  Operation *pOVar10;
  HelperCall call;
  uint i;
  long lVar11;
  Op op;
  uint32_t op_kind;
  Id ballot [4];
  Capability local_6c;
  undefined1 local_5c [4];
  Capability local_58;
  Capability local_54;
  Capability local_50;
  Capability local_4c;
  Id local_48 [6];
  
  pBVar6 = Converter::Impl::builder(impl);
  call = WaveMultiPrefixBitAnd;
  bVar1 = get_constant_operand(&instruction->super_Instruction,6,(uint32_t *)local_5c);
  if (bVar1) {
    pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    pTVar8 = LLVMBC::Value::getType(pVVar7);
    bVar1 = LLVMBC::Type::isIntegerTy(pTVar8);
    switch(local_5c[0]) {
    case 0:
      op = OpGroupNonUniformFAdd - bVar1;
      call = bVar1 | WaveMultiPrefixFAdd;
      break;
    case 1:
      op = OpGroupNonUniformBitwiseAnd;
      break;
    case 2:
      call = WaveMultiPrefixBitOr;
      op = OpGroupNonUniformBitwiseOr;
      break;
    case 3:
      call = WaveMultiPrefixBitXor;
      op = OpGroupNonUniformBitwiseXor;
      break;
    case 4:
      op = OpGroupNonUniformFMul - bVar1;
      call = bVar1 | WaveMultiPrefixFMul;
      break;
    default:
      goto switchD_0016d955_default;
    }
    pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    pTVar8 = LLVMBC::Value::getType(pVVar7);
    IVar2 = Converter::Impl::get_type_id(impl,pTVar8,0);
    if ((impl->options).nv_subgroup_partition_enabled == true) {
      spv::Builder::addExtension(pBVar6,"SPV_NV_shader_subgroup_partitioned");
      local_58 = CapabilityGroupNonUniformPartitionedNV;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar6->capabilities,&local_58);
      this = Converter::Impl::allocate(impl,op,(Value *)instruction);
      IVar2 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
      IVar2 = spv::Builder::makeIntConstant(pBVar6,IVar2,3,false);
      Operation::add_id(this,IVar2);
      Operation::add_literal(this,8);
    }
    else {
      IVar2 = SPIRVModule::get_helper_call_id(impl->spirv_module,call,IVar2);
      this = Converter::Impl::allocate(impl,OpFunctionCall,(Value *)instruction);
      Operation::add_id(this,IVar2);
    }
    pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    lVar11 = 0;
    IVar2 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
    Operation::add_id(this,IVar2);
    do {
      pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)lVar11 + 2);
      IVar2 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
      local_48[lVar11] = IVar2;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    IVar2 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
    IVar2 = Converter::Impl::build_vector(impl,IVar2,local_48,4);
    if ((impl->options).nv_subgroup_partition_enabled != false) {
      pBVar6 = Converter::Impl::builder(impl);
      IVar3 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
      IVar3 = spv::Builder::makeVectorType(pBVar6,IVar3,4);
      local_58 = CapabilityGroupNonUniformBallot;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar6->capabilities,&local_58);
      pOVar9 = Converter::Impl::allocate(impl,OpGroupNonUniformBallot,IVar3);
      IVar4 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
      IVar4 = spv::Builder::makeIntConstant(pBVar6,IVar4,3,false);
      Operation::add_id(pOVar9,IVar4);
      if (((impl->execution_model == ExecutionModelFragment) &&
          ((impl->options).strict_helper_lane_waveops == true)) &&
         (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
        IVar4 = spv::Builder::makeBoolType(pBVar6);
        pOVar10 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar4);
        Converter::Impl::add(impl,pOVar10,false);
        local_6c = pOVar10->id;
        IVar4 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
        IVar4 = spv::Builder::makeVectorType(pBVar6,IVar4,4);
        pOVar10 = Converter::Impl::allocate(impl,OpGroupNonUniformBallot,IVar4);
        IVar4 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
        IVar4 = spv::Builder::makeIntConstant(pBVar6,IVar4,3,false);
        Operation::add_id(pOVar10,IVar4);
        Operation::add_id(pOVar10,local_6c);
        Converter::Impl::add(impl,pOVar10,false);
        local_58 = CapabilityGroupNonUniformBallot;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&pBVar6->capabilities,&local_58);
        IVar4 = pOVar10->id;
        IVar5 = spv::Builder::makeBoolType(pBVar6);
        pOVar10 = Converter::Impl::allocate(impl,OpLogicalNot,IVar5);
        Operation::add_id(pOVar10,local_6c);
        Converter::Impl::add(impl,pOVar10,false);
        IVar5 = pOVar10->id;
      }
      else {
        local_6c = CapabilityMatrix;
        IVar5 = spv::Builder::makeBoolConstant(pBVar6,true,false);
        IVar4 = 0;
      }
      Operation::add_id(pOVar9,IVar5);
      Converter::Impl::add(impl,pOVar9,false);
      pOVar10 = Converter::Impl::allocate(impl,OpBitwiseAnd,IVar3);
      Operation::add_id(pOVar10,IVar2);
      Operation::add_id(pOVar10,pOVar9->id);
      Converter::Impl::add(impl,pOVar10,false);
      if (((impl->execution_model == ExecutionModelFragment) &&
          ((impl->options).strict_helper_lane_waveops == true)) &&
         (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
        local_58 = local_6c;
        local_54 = local_6c;
        local_50 = local_6c;
        local_4c = local_6c;
        IVar2 = spv::Builder::makeBoolType(pBVar6);
        IVar2 = Converter::Impl::build_vector(impl,IVar2,&local_58,4);
        IVar3 = spv::Builder::makeIntegerType(pBVar6,0x20,false);
        IVar3 = spv::Builder::makeVectorType(pBVar6,IVar3,4);
        pOVar9 = Converter::Impl::allocate(impl,OpSelect,IVar3);
        Operation::add_id(pOVar9,IVar2);
        Operation::add_id(pOVar9,IVar4);
        Operation::add_id(pOVar9,pOVar10->id);
        Converter::Impl::add(impl,pOVar9,false);
        IVar2 = pOVar9->id;
      }
      else {
        IVar2 = pOVar10->id;
      }
    }
    Operation::add_id(this,IVar2);
    if ((((impl->options).nv_subgroup_partition_enabled == false) &&
        (impl->execution_model == ExecutionModelFragment)) &&
       (((impl->options).strict_helper_lane_waveops == true &&
        (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)))) {
      pBVar6 = Converter::Impl::builder(impl);
      IVar2 = spv::Builder::makeBoolType(pBVar6);
      pOVar9 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar2);
      Converter::Impl::add(impl,pOVar9,false);
      Operation::add_id(this,pOVar9->id);
    }
    Converter::Impl::add(impl,this,false);
    bVar1 = true;
  }
  else {
switchD_0016d955_default:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool emit_wave_multi_prefix_op_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	uint32_t op_kind;
	if (!get_constant_operand(instruction, 6, &op_kind))
		return false;

	HelperCall helper_call;
	spv::Op partitioned_op;
	bool fp = !instruction->getOperand(1)->getType()->isIntegerTy();

	switch (static_cast<DXIL::WaveMultiPrefixOpKind>(op_kind))
	{
	case DXIL::WaveMultiPrefixOpKind::Sum:
		helper_call = fp ? HelperCall::WaveMultiPrefixFAdd : HelperCall::WaveMultiPrefixIAdd;
		partitioned_op = fp ? spv::OpGroupNonUniformFAdd : spv::OpGroupNonUniformIAdd;
		break;

	case DXIL::WaveMultiPrefixOpKind::Product:
		helper_call = fp ? HelperCall::WaveMultiPrefixFMul : HelperCall::WaveMultiPrefixIMul;
		partitioned_op = fp ? spv::OpGroupNonUniformFMul : spv::OpGroupNonUniformIMul;
		break;

	case DXIL::WaveMultiPrefixOpKind::And:
		helper_call = HelperCall::WaveMultiPrefixBitAnd;
		partitioned_op = spv::OpGroupNonUniformBitwiseAnd;
		break;

	case DXIL::WaveMultiPrefixOpKind::Or:
		helper_call = HelperCall::WaveMultiPrefixBitOr;
		partitioned_op = spv::OpGroupNonUniformBitwiseOr;
		break;

	case DXIL::WaveMultiPrefixOpKind::Xor:
		helper_call = HelperCall::WaveMultiPrefixBitXor;
		partitioned_op = spv::OpGroupNonUniformBitwiseXor;
		break;

	default:
		return false;
	}

	spv::Id type_id = impl.get_type_id(instruction->getOperand(1)->getType());

	Operation *op;

	if (impl.options.nv_subgroup_partition_enabled)
	{
		builder.addExtension("SPV_NV_shader_subgroup_partitioned");
		builder.addCapability(spv::CapabilityGroupNonUniformPartitionedNV);
		op = impl.allocate(partitioned_op, instruction);
		op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		op->add_literal(spv::GroupOperationPartitionedExclusiveScanNV);
	}
	else
	{
		spv::Id call_id = impl.spirv_module.get_helper_call_id(helper_call, type_id);
		op = impl.allocate(spv::OpFunctionCall, instruction);
		op->add_id(call_id);
	}

	op->add_id(impl.get_id_for_value(instruction->getOperand(1)));

	spv::Id ballot[4];
	for (unsigned i = 0; i < 4; i++)
		ballot[i] = impl.get_id_for_value(instruction->getOperand(2 + i));

	spv::Id ballot_value = impl.build_vector(builder.makeUintType(32), ballot, 4);

	// Have to explicitly ignore inactive lanes here to make sure that lanes in the same partition have equal
	// partition values.
	if (impl.options.nv_subgroup_partition_enabled)
		ballot_value = emit_masked_ballot(impl, ballot_value);

	op->add_id(ballot_value);

	if (!impl.options.nv_subgroup_partition_enabled &&
	    wave_op_needs_helper_lane_masking(impl))
	{
		auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, impl.builder().makeBoolType());
		impl.add(is_helper_lane);
		op->add_id(is_helper_lane->id);
	}

	impl.add(op);

	return true;
}